

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

void deqp::gles31::bb::anon_unknown_11::unmapBuffers
               (Functions *gl,
               vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
               *buffers)

{
  glBindBufferFunc p_Var1;
  GLenum err;
  size_type sVar2;
  const_reference pvVar3;
  int local_1c;
  int ndx;
  vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
  *buffers_local;
  Functions *gl_local;
  
  local_1c = 0;
  while( true ) {
    sVar2 = std::
            vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
            ::size(buffers);
    if ((int)sVar2 <= local_1c) break;
    pvVar3 = std::
             vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
             ::operator[](buffers,(long)local_1c);
    if (0 < pvVar3->size) {
      p_Var1 = gl->bindBuffer;
      pvVar3 = std::
               vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
               ::operator[](buffers,(long)local_1c);
      (*p_Var1)(0x90d2,pvVar3->buffer);
      (*gl->unmapBuffer)(0x90d2);
    }
    local_1c = local_1c + 1;
  }
  err = (*gl->getError)();
  glu::checkError(err,"Failed to unmap buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0x7e9);
  return;
}

Assistant:

void unmapBuffers (const glw::Functions& gl, const vector<Buffer>& buffers)
{
	for (int ndx = 0; ndx < (int)buffers.size(); ndx++)
	{
		if (buffers[ndx].size > 0)
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffers[ndx].buffer);
			gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unmap buffer");
}